

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_strfmt.c
# Opt level: O0

char * lj_strfmt_pushvf(lua_State *L,char *fmt,__va_list_tag *argp)

{
  undefined4 uVar1;
  uint uVar2;
  uint64_t uVar3;
  TValue *pTVar4;
  undefined8 sb_00;
  SFormat sf_00;
  size_t sVar5;
  GCstr *pGVar6;
  undefined8 *local_258;
  undefined4 *local_238;
  long *local_208;
  lua_Number *local_1f0;
  uint *local_1c8;
  int *local_1a0;
  char *local_168;
  char *s;
  GCstr *str;
  undefined1 auStack_150 [4];
  SFormat sf;
  FormatState fs;
  SBuf *sb;
  __va_list_tag *argp_local;
  char *fmt_local;
  lua_State *L_local;
  SBuf *sb_1;
  char *w_1;
  char *local_c0;
  char *w;
  char *local_90;
  
  uVar3 = (L->glref).ptr64;
  fs._24_8_ = uVar3 + 200;
  *(lua_State **)(uVar3 + 0xe0) = L;
  *(undefined8 *)fs._24_8_ = *(undefined8 *)(uVar3 + 0xd8);
  sVar5 = strlen(fmt);
  fs.p = (uint8_t *)(fmt + (sVar5 & 0xffffffff));
  _auStack_150 = (uint8_t *)fmt;
  do {
    sf_00 = lj_strfmt_parse((FormatState *)auStack_150);
    sb_00 = fs._24_8_;
    if (sf_00 == 0) {
      pGVar6 = lj_str_new(L,*(char **)(fs._24_8_ + 0x10),
                          (ulong)(uint)((int)*(undefined8 *)fs._24_8_ -
                                       (int)*(undefined8 *)(fs._24_8_ + 0x10)));
      L->top->u64 = (ulong)pGVar6 | 0xfffd800000000000;
      pTVar4 = L->top;
      L->top = pTVar4 + 1;
      if ((TValue *)(L->maxstack).ptr64 <= pTVar4 + 1) {
        lj_state_growstack1(L);
      }
      return (char *)(pGVar6 + 1);
    }
    switch(sf_00 & 0xf) {
    case 1:
    default:
      if ((int)*(undefined8 *)(fs._24_8_ + 8) == (int)*(undefined8 *)fs._24_8_) {
        local_c0 = lj_buf_more2((SBuf *)fs._24_8_,1);
      }
      else {
        local_c0 = *(char **)fs._24_8_;
      }
      *local_c0 = '?';
      *(char **)sb_00 = local_c0 + 1;
      break;
    case 2:
      lj_buf_putmem((SBuf *)fs._24_8_,fs.e,(MSize)fs.str);
      break;
    case 3:
      uVar2 = argp->gp_offset;
      if (uVar2 < 0x29) {
        local_1a0 = (int *)((long)(int)uVar2 + (long)argp->reg_save_area);
        argp->gp_offset = uVar2 + 8;
      }
      else {
        local_1a0 = (int *)argp->overflow_arg_area;
        argp->overflow_arg_area = local_1a0 + 2;
      }
      lj_strfmt_putfxint((SBuf *)fs._24_8_,sf_00,(long)*local_1a0);
      break;
    case 4:
      uVar2 = argp->gp_offset;
      if (uVar2 < 0x29) {
        local_1c8 = (uint *)((long)(int)uVar2 + (long)argp->reg_save_area);
        argp->gp_offset = uVar2 + 8;
      }
      else {
        local_1c8 = (uint *)argp->overflow_arg_area;
        argp->overflow_arg_area = local_1c8 + 2;
      }
      lj_strfmt_putfxint((SBuf *)fs._24_8_,sf_00,(ulong)*local_1c8);
      break;
    case 5:
      uVar2 = argp->fp_offset;
      if (uVar2 < 0xa1) {
        local_1f0 = (lua_Number *)((long)(int)uVar2 + (long)argp->reg_save_area);
        argp->fp_offset = uVar2 + 0x10;
      }
      else {
        local_1f0 = (lua_Number *)argp->overflow_arg_area;
        argp->overflow_arg_area = local_1f0 + 1;
      }
      lj_strfmt_putfnum((SBuf *)fs._24_8_,0xf000035,*local_1f0);
      break;
    case 6:
      uVar2 = argp->gp_offset;
      if (uVar2 < 0x29) {
        local_208 = (long *)((long)(int)uVar2 + (long)argp->reg_save_area);
        argp->gp_offset = uVar2 + 8;
      }
      else {
        local_208 = (long *)argp->overflow_arg_area;
        argp->overflow_arg_area = local_208 + 1;
      }
      local_168 = (char *)*local_208;
      if (local_168 == (char *)0x0) {
        local_168 = "(null)";
      }
      sVar5 = strlen(local_168);
      lj_buf_putmem((SBuf *)sb_00,local_168,(MSize)sVar5);
      break;
    case 7:
      uVar2 = argp->gp_offset;
      if (uVar2 < 0x29) {
        local_238 = (undefined4 *)((long)(int)uVar2 + (long)argp->reg_save_area);
        argp->gp_offset = uVar2 + 8;
      }
      else {
        local_238 = (undefined4 *)argp->overflow_arg_area;
        argp->overflow_arg_area = local_238 + 2;
      }
      uVar1 = *local_238;
      if ((int)*(undefined8 *)(fs._24_8_ + 8) == (int)*(undefined8 *)fs._24_8_) {
        local_90 = lj_buf_more2((SBuf *)fs._24_8_,1);
      }
      else {
        local_90 = *(char **)fs._24_8_;
      }
      *local_90 = (char)uVar1;
      *(char **)sb_00 = local_90 + 1;
      break;
    case 8:
      uVar2 = argp->gp_offset;
      if (uVar2 < 0x29) {
        local_258 = (undefined8 *)((long)(int)uVar2 + (long)argp->reg_save_area);
        argp->gp_offset = uVar2 + 8;
      }
      else {
        local_258 = (undefined8 *)argp->overflow_arg_area;
        argp->overflow_arg_area = local_258 + 1;
      }
      lj_strfmt_putptr((SBuf *)fs._24_8_,(void *)*local_258);
    }
  } while( true );
}

Assistant:

const char *lj_strfmt_pushvf(lua_State *L, const char *fmt, va_list argp)
{
  SBuf *sb = lj_buf_tmp_(L);
  FormatState fs;
  SFormat sf;
  GCstr *str;
  lj_strfmt_init(&fs, fmt, (MSize)strlen(fmt));
  while ((sf = lj_strfmt_parse(&fs)) != STRFMT_EOF) {
    switch (STRFMT_TYPE(sf)) {
    case STRFMT_LIT:
      lj_buf_putmem(sb, fs.str, fs.len);
      break;
    case STRFMT_INT:
      lj_strfmt_putfxint(sb, sf, va_arg(argp, int32_t));
      break;
    case STRFMT_UINT:
      lj_strfmt_putfxint(sb, sf, va_arg(argp, uint32_t));
      break;
    case STRFMT_NUM:
      lj_strfmt_putfnum(sb, STRFMT_G14, va_arg(argp, lua_Number));
      break;
    case STRFMT_STR: {
      const char *s = va_arg(argp, char *);
      if (s == NULL) s = "(null)";
      lj_buf_putmem(sb, s, (MSize)strlen(s));
      break;
      }
    case STRFMT_CHAR:
      lj_buf_putb(sb, va_arg(argp, int));
      break;
    case STRFMT_PTR:
      lj_strfmt_putptr(sb, va_arg(argp, void *));
      break;
    case STRFMT_ERR:
    default:
      lj_buf_putb(sb, '?');
      lj_assertL(0, "bad string format near offset %d", fs.len);
      break;
    }
  }
  str = lj_buf_str(L, sb);
  setstrV(L, L->top, str);
  incr_top(L);
  return strdata(str);
}